

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_get_option(spng_ctx *ctx,spng_option option,int *value)

{
  spng_filter_choice sVar1;
  int iVar2;
  
  iVar2 = 1;
  if (value == (int *)0x0 || ctx == (spng_ctx *)0x0) {
    return 1;
  }
  if (ctx->state == SPNG_STATE_INVALID) {
    return 0x46;
  }
  switch(option) {
  case SPNG_KEEP_UNKNOWN_CHUNKS:
    sVar1 = *(uint *)&ctx->field_0xcc >> 8;
    goto LAB_001086cd;
  case SPNG_IMG_COMPRESSION_LEVEL:
    sVar1 = (ctx->image_options).compression_level;
    break;
  case SPNG_IMG_WINDOW_BITS:
    sVar1 = (ctx->image_options).window_bits;
    break;
  case SPNG_IMG_MEM_LEVEL:
    sVar1 = (ctx->image_options).mem_level;
    break;
  case SPNG_IMG_COMPRESSION_STRATEGY:
    sVar1 = (ctx->image_options).strategy;
    break;
  case SPNG_TEXT_COMPRESSION_LEVEL:
    sVar1 = (ctx->text_options).compression_level;
    break;
  case SPNG_TEXT_WINDOW_BITS:
    sVar1 = (ctx->text_options).window_bits;
    break;
  case SPNG_TEXT_MEM_LEVEL:
    sVar1 = (ctx->text_options).mem_level;
    break;
  case SPNG_TEXT_COMPRESSION_STRATEGY:
    sVar1 = (ctx->text_options).strategy;
    break;
  case SPNG_FILTER_CHOICE:
    sVar1 = (ctx->encode_flags).filter_choice;
    break;
  case SPNG_CHUNK_COUNT_LIMIT:
    sVar1 = ctx->chunk_count_limit;
    break;
  case SPNG_ENCODE_TO_BUFFER:
    sVar1 = *(uint *)&ctx->field_0xcc >> 1;
LAB_001086cd:
    sVar1 = sVar1 & 1;
    break;
  default:
    goto switchD_001086b2_default;
  }
  *value = sVar1;
  iVar2 = 0;
switchD_001086b2_default:
  return iVar2;
}

Assistant:

int spng_get_option(spng_ctx *ctx, enum spng_option option, int *value)
{
    if(ctx == NULL || value == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;

    switch(option)
    {
        case SPNG_KEEP_UNKNOWN_CHUNKS:
        {
            *value = ctx->keep_unknown;
            break;
        }
        case SPNG_IMG_COMPRESSION_LEVEL:
        {
            *value = ctx->image_options.compression_level;
            break;
        }
            case SPNG_IMG_WINDOW_BITS:
        {
            *value = ctx->image_options.window_bits;
            break;
        }
        case SPNG_IMG_MEM_LEVEL:
        {
            *value = ctx->image_options.mem_level;
            break;
        }
        case SPNG_IMG_COMPRESSION_STRATEGY:
        {
            *value = ctx->image_options.strategy;
            break;
        }
        case SPNG_TEXT_COMPRESSION_LEVEL:
        {
            *value = ctx->text_options.compression_level;
            break;
        }
            case SPNG_TEXT_WINDOW_BITS:
        {
            *value = ctx->text_options.window_bits;
            break;
        }
        case SPNG_TEXT_MEM_LEVEL:
        {
            *value = ctx->text_options.mem_level;
            break;
        }
        case SPNG_TEXT_COMPRESSION_STRATEGY:
        {
            *value = ctx->text_options.strategy;
            break;
        }
        case SPNG_FILTER_CHOICE:
        {
            *value = ctx->encode_flags.filter_choice;
            break;
        }
        case SPNG_CHUNK_COUNT_LIMIT:
        {
            *value = ctx->chunk_count_limit;
            break;
        }
        case SPNG_ENCODE_TO_BUFFER:
        {
            if(ctx->internal_buffer) *value = 1;
            else *value = 0;

            break;
        }
        default: return 1;
    }

    return 0;
}